

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0043b3c8 == '\x01') {
    DAT_0043b3c8 = '\0';
    (*(code *)*_LinearKernel_default_instance_)();
  }
  if (DAT_0043b3f0 == '\x01') {
    DAT_0043b3f0 = '\0';
    (*(code *)*_RBFKernel_default_instance_)();
  }
  if (DAT_0043b420 == '\x01') {
    DAT_0043b420 = '\0';
    (*(code *)*_PolyKernel_default_instance_)();
  }
  if (DAT_0043b450 == '\x01') {
    DAT_0043b450 = '\0';
    (*(code *)*_SigmoidKernel_default_instance_)();
  }
  if (DAT_0043b478 == '\x01') {
    DAT_0043b478 = '\0';
    (*(code *)*_Kernel_default_instance_)();
  }
  if (DAT_0043b4c0 == '\x01') {
    DAT_0043b4c0 = '\0';
    (*(code *)*_SparseNode_default_instance_)();
  }
  if (DAT_0043b4f8 == '\x01') {
    DAT_0043b4f8 = '\0';
    (*(code *)*_SparseVector_default_instance_)();
  }
  if (DAT_0043b530 == '\x01') {
    DAT_0043b530 = '\0';
    (*(code *)*_SparseSupportVectors_default_instance_)();
  }
  if (DAT_0043b560 == '\x01') {
    DAT_0043b560 = '\0';
    (*(code *)*_DenseVector_default_instance_)();
  }
  if (DAT_0043b598 == '\x01') {
    DAT_0043b598 = '\0';
    (*(code *)*_DenseSupportVectors_default_instance_)();
  }
  if (DAT_0043b5c8 == '\x01') {
    DAT_0043b5c8 = '\0';
    (*(code *)*_Coefficients_default_instance_)();
  }
  if (DAT_0043b608 == '\x01') {
    DAT_0043b608 = '\0';
    (*(code *)*_SupportVectorRegressor_default_instance_)();
  }
  if (DAT_0043b6d0 == '\x01') {
    DAT_0043b6d0 = 0;
    (*(code *)*_SupportVectorClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}